

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O0

void printUsage(char *executable)

{
  ostream *poVar1;
  char *in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,in_RDI);
  poVar1 = std::operator<<(poVar1," [OPTIONS]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Supported options:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "  --softAes         use software AES (default: x86 AES-NI)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  --nonce  N        seed nonce (default: 1000)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "  --genAsm          generate x86-64 asm code for nonce N");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "  --genNative       generate DefyX code for nonce N");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "  --genSuperscalar  generate superscalar program for nonce N");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printUsage(const char* executable) {
	std::cout << "Usage: " << executable << " [OPTIONS]" << std::endl;
	std::cout << "Supported options:" << std::endl;
	std::cout << "  --softAes         use software AES (default: x86 AES-NI)" << std::endl;
	std::cout << "  --nonce  N        seed nonce (default: 1000)" << std::endl;
	std::cout << "  --genAsm          generate x86-64 asm code for nonce N" << std::endl;
	std::cout << "  --genNative       generate DefyX code for nonce N" << std::endl;
	std::cout << "  --genSuperscalar  generate superscalar program for nonce N" << std::endl;
}